

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O2

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,H10 *hasher,ZopfliNode *nodes)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  uint32_t *puVar7;
  uint32_t uVar8;
  uint8_t *puVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  uint8_t *puVar26;
  int *data;
  uint8_t *puVar27;
  bool bVar28;
  BackwardMatch *local_19b0;
  ulong local_19a8;
  ulong local_19a0;
  uint local_1998;
  uint local_1978;
  uint local_1970;
  uint local_1968;
  long local_1950;
  long local_1948;
  uint32_t local_1908 [38];
  StartPosQueue queue;
  BackwardMatch matches [128];
  ZopfliCostModel local_1368;
  
  uVar13 = 0x145;
  if (params->quality < 0xb) {
    uVar13 = 0x96;
  }
  lVar14 = num_bytes - 0x7f;
  if (num_bytes < 0x7f) {
    lVar14 = 0;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,&local_1368,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&local_1368,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  sVar24 = 0;
  do {
    if (num_bytes <= sVar24 + 3) {
      BrotliFree(m,local_1368.literal_costs_);
      sVar24 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar24;
    }
    uVar1 = sVar24 + position;
    sVar12 = max_backward_limit;
    if (uVar1 < max_backward_limit) {
      sVar12 = uVar1;
    }
    uVar10 = num_bytes - sVar24;
    uVar17 = 0x10;
    if (params->quality == 0xb) {
      uVar17 = 0x40;
    }
    uVar5 = 0;
    if (uVar17 <= uVar1) {
      uVar5 = uVar1 - uVar17;
    }
    data = (int *)(ringbuffer + (uVar1 & ringbuffer_mask));
    local_19b0 = matches;
    uVar17 = uVar1;
    uVar16 = 1;
    while (((uVar17 = uVar17 - 1, uVar5 < uVar17 && (uVar16 < 3)) && (uVar1 - uVar17 <= sVar12))) {
      uVar19 = uVar17 & ringbuffer_mask;
      if (((uint8_t)*data == ringbuffer[uVar19]) &&
         (*(uint8_t *)((long)data + 1) == ringbuffer[uVar19 + 1])) {
        uVar21 = 0;
        lVar22 = 0;
LAB_0010d40a:
        uVar25 = uVar10 & 0xfffffffffffffff8;
        uVar11 = (ulong)((uint)uVar10 & 7);
        if (uVar10 >> 3 == uVar21) {
          for (; (uVar21 = uVar10, uVar11 != 0 &&
                 (uVar21 = uVar25, ringbuffer[uVar25 + uVar19] == *(uint8_t *)((long)data + uVar25))
                 ); uVar25 = uVar25 + 1) {
            uVar11 = uVar11 - 1;
          }
        }
        else {
          if (*(ulong *)(data + uVar21 * 2) == *(ulong *)(ringbuffer + uVar21 * 8 + uVar19))
          goto code_r0x0010d41c;
          uVar21 = *(ulong *)(ringbuffer + uVar21 * 8 + uVar19) ^ *(ulong *)(data + uVar21 * 2);
          uVar19 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
            }
          }
          uVar21 = (uVar19 >> 3 & 0x1fffffff) - lVar22;
        }
        if (uVar16 < uVar21) {
          local_19b0->distance = (uint32_t)(uVar1 - uVar17);
          local_19b0->length_and_code = (int)uVar21 << 5;
          local_19b0 = local_19b0 + 1;
          uVar16 = uVar21;
        }
      }
    }
    local_1978 = (uint)ringbuffer_mask;
    if (uVar16 < uVar10) {
      uVar2 = (uint)(*data * 0x1e35a7bd) >> 0xf;
      uVar4 = hasher->buckets_[uVar2];
      uVar17 = uVar10;
      if (0x7f < uVar10) {
        hasher->buckets_[uVar2] = (uint32_t)uVar1;
        uVar17 = 0x80;
      }
      uVar5 = hasher->window_mask_;
      uVar19 = uVar5 & uVar1;
      local_1948 = uVar19 * 2 + 1;
      local_1950 = uVar19 * 2;
      uVar19 = 0;
      local_19a8 = 0;
      lVar22 = 0x40;
      while (uVar21 = uVar1 - uVar4, uVar21 != 0) {
        bVar28 = lVar22 == 0;
        lVar22 = lVar22 + -1;
        if ((sVar12 < uVar21) || (bVar28)) break;
        uVar25 = local_19a8;
        if (uVar19 < local_19a8) {
          uVar25 = uVar19;
        }
        if (0x80 < uVar25) {
LAB_0010ddfc:
          __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0x9d,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        puVar26 = ringbuffer + (uVar4 & local_1978);
        uVar11 = uVar10 - uVar25;
        uVar15 = uVar11 & 0xfffffffffffffff8;
        uVar20 = 0;
        lVar18 = 0;
LAB_0010d589:
        if (uVar11 >> 3 == uVar20) {
          uVar23 = (ulong)((uint)uVar11 & 7);
          puVar27 = puVar26 + (uVar25 - lVar18);
          for (; (bVar28 = uVar23 != 0, uVar23 = uVar23 - 1, uVar20 = uVar11, bVar28 &&
                 (uVar20 = uVar15, *(uint8_t *)((long)data + uVar15 + uVar25) == *puVar27));
              uVar15 = uVar15 + 1) {
            puVar27 = puVar27 + 1;
          }
        }
        else {
          uVar23 = *(ulong *)((long)data + uVar20 * 8 + uVar25);
          if (*(ulong *)(puVar26 + uVar20 * 8 + uVar25) == uVar23) goto code_r0x0010d59f;
          uVar23 = uVar23 ^ *(ulong *)(puVar26 + uVar20 * 8 + uVar25);
          uVar11 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          uVar20 = (uVar11 >> 3 & 0x1fffffff) - lVar18;
        }
        uVar20 = uVar20 + uVar25;
        iVar3 = bcmp(data,puVar26,uVar20);
        if (iVar3 != 0) {
LAB_0010de1b:
          __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0xa2,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        if (local_19b0 == (BackwardMatch *)0x0) {
          local_19b0 = (BackwardMatch *)0x0;
        }
        else if (uVar16 < uVar20) {
          local_19b0->distance = (uint32_t)uVar21;
          local_19b0->length_and_code = (int)uVar20 << 5;
          local_19b0 = local_19b0 + 1;
          uVar16 = uVar20;
        }
        local_1968 = (uint)uVar5;
        if (uVar17 <= uVar20) {
          if (uVar10 < 0x80) goto LAB_0010d74c;
          puVar7 = hasher->forest_;
          puVar7[local_1950] = puVar7[(ulong)(local_1968 & uVar4) * 2];
          uVar8 = puVar7[(ulong)(local_1968 & uVar4) * 2 + 1];
          goto LAB_0010d738;
        }
        puVar7 = hasher->forest_;
        if (puVar26[uVar20] < *(byte *)((long)data + uVar20)) {
          if (0x7f < uVar10) {
            puVar7[local_1950] = uVar4;
          }
          lVar18 = (ulong)(uVar4 & local_1968) * 2 + 1;
          uVar19 = uVar20;
          local_1950 = lVar18;
        }
        else {
          if (0x7f < uVar10) {
            puVar7[local_1948] = uVar4;
          }
          lVar18 = (ulong)(uVar4 & local_1968) * 2;
          local_19a8 = uVar20;
          local_1948 = lVar18;
        }
        uVar4 = puVar7[lVar18];
      }
      if (0x7f < uVar10) {
        uVar8 = hasher->invalid_pos_;
        puVar7 = hasher->forest_;
        puVar7[local_1950] = uVar8;
LAB_0010d738:
        puVar7[local_1948] = uVar8;
      }
    }
LAB_0010d74c:
    for (lVar22 = 0; lVar22 != 0x26; lVar22 = lVar22 + 1) {
      local_1908[lVar22] = 0xfffffff;
    }
    uVar17 = uVar16 + 1;
    if (uVar16 + 1 < 5) {
      uVar17 = 4;
    }
    iVar3 = BrotliFindAllStaticDictionaryMatches((uint8_t *)data,uVar17,uVar10,local_1908);
    if (iVar3 != 0) {
      if (0x24 < uVar10) {
        uVar10 = 0x25;
      }
      iVar3 = (int)uVar17 << 5;
      for (; uVar17 <= uVar10; uVar17 = uVar17 + 1) {
        uVar4 = local_1908[uVar17];
        if (uVar4 < 0xfffffff) {
          uVar2 = uVar4 & 0x1f;
          local_19b0->distance = (uVar4 >> 5) + (int)sVar12 + 1;
          if (uVar17 == uVar2) {
            uVar2 = 0;
          }
          local_19b0->length_and_code = uVar2 + iVar3;
          local_19b0 = local_19b0 + 1;
        }
        iVar3 = iVar3 + 0x20;
      }
    }
    if ((long)local_19b0 - (long)matches == 0) {
      sVar12 = 0;
    }
    else {
      sVar12 = (long)local_19b0 - (long)matches >> 3;
      if (uVar13 < local_19b0[-1].length_and_code >> 5) {
        matches[0] = matches[sVar12 - 1];
        sVar12 = 1;
      }
    }
    sVar6 = UpdateNodes(num_bytes,position,sVar24,ringbuffer,ringbuffer_mask,params,
                        max_backward_limit,dist_cache,sVar12,matches,&local_1368,&queue,nodes);
    uVar17 = 0;
    if (0x3fff < sVar6) {
      uVar17 = sVar6;
    }
    if (sVar12 == 1) {
      uVar4 = matches[0].length_and_code >> 5;
      if ((uVar13 < uVar4) && (uVar17 < uVar4)) {
        uVar17 = (ulong)uVar4;
      }
    }
    if (1 < uVar17) {
      uVar10 = uVar1 + 1;
      uVar5 = uVar17 + uVar1;
      if (lVar14 + position <= uVar17 + uVar1) {
        uVar5 = lVar14 + position;
      }
      uVar16 = uVar5 - 0x3f;
      if (uVar5 < uVar1 + 0x40) {
        uVar16 = uVar10;
      }
      if (uVar1 + 0x201 <= uVar16) {
        for (; uVar10 < uVar16; uVar10 = uVar10 + 8) {
          uVar1 = hasher->window_mask_;
          puVar26 = ringbuffer + (uVar10 & ringbuffer_mask);
          uVar2 = (uint)(*(int *)(ringbuffer + (uVar10 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
          uVar4 = hasher->buckets_[uVar2];
          local_19a0 = (uVar1 & uVar10) * 2 + 1;
          local_19a8 = (uVar1 & uVar10) * 2;
          hasher->buckets_[uVar2] = (uint32_t)uVar10;
          uVar21 = 0;
          uVar19 = 0;
          lVar22 = 0x40;
          while (uVar10 != uVar4) {
            bVar28 = lVar22 == 0;
            lVar22 = lVar22 + -1;
            if ((uVar1 - 0xf < uVar10 - uVar4) || (bVar28)) break;
            uVar25 = uVar19;
            if (uVar21 < uVar19) {
              uVar25 = uVar21;
            }
            if (0x80 < uVar25) goto LAB_0010ddfc;
            puVar27 = ringbuffer + (uVar4 & local_1978);
            uVar20 = 0x80 - uVar25;
            uVar11 = (ulong)((uint)uVar20 & 0xf8);
            uVar15 = 0;
            lVar18 = 0;
LAB_0010da0c:
            if (uVar20 >> 3 == uVar15) {
              uVar23 = (ulong)((uint)uVar20 & 7);
              puVar9 = puVar27 + (uVar25 - lVar18);
              for (; (bVar28 = uVar23 != 0, uVar23 = uVar23 - 1, uVar15 = uVar20, bVar28 &&
                     (uVar15 = uVar11, puVar26[uVar11 + uVar25] == *puVar9)); uVar11 = uVar11 + 1) {
                puVar9 = puVar9 + 1;
              }
            }
            else {
              if (*(ulong *)(puVar27 + uVar15 * 8 + uVar25) ==
                  *(ulong *)(puVar26 + uVar15 * 8 + uVar25)) goto code_r0x0010da22;
              uVar15 = *(ulong *)(puVar26 + uVar15 * 8 + uVar25) ^
                       *(ulong *)(puVar27 + uVar15 * 8 + uVar25);
              uVar11 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
                }
              }
              uVar15 = (uVar11 >> 3 & 0x1fffffff) - lVar18;
            }
            uVar15 = uVar15 + uVar25;
            iVar3 = bcmp(puVar26,puVar27,uVar15);
            if (iVar3 != 0) goto LAB_0010de1b;
            local_1970 = (uint)uVar1;
            if (0x7f < uVar15) {
              puVar7 = hasher->forest_;
              puVar7[local_19a8] = puVar7[(ulong)(local_1970 & uVar4) * 2];
              uVar8 = puVar7[(ulong)(local_1970 & uVar4) * 2 + 1];
              goto LAB_0010db36;
            }
            uVar25 = (ulong)(uVar4 & local_1970) * 2;
            puVar7 = hasher->forest_;
            if (puVar27[uVar15] < puVar26[uVar15]) {
              puVar7[local_19a8] = uVar4;
              uVar25 = uVar25 | 1;
              uVar21 = uVar15;
              local_19a8 = uVar25;
            }
            else {
              puVar7[local_19a0] = uVar4;
              uVar19 = uVar15;
              local_19a0 = uVar25;
            }
            uVar4 = puVar7[uVar25];
          }
          uVar8 = hasher->invalid_pos_;
          puVar7 = hasher->forest_;
          puVar7[local_19a8] = uVar8;
LAB_0010db36:
          puVar7[local_19a0] = uVar8;
        }
      }
      for (; uVar16 < uVar5; uVar16 = uVar16 + 1) {
        uVar1 = hasher->window_mask_;
        puVar26 = ringbuffer + (uVar16 & ringbuffer_mask);
        uVar2 = (uint)(*(int *)(ringbuffer + (uVar16 & ringbuffer_mask)) * 0x1e35a7bd) >> 0xf;
        uVar4 = hasher->buckets_[uVar2];
        local_19a0 = (uVar1 & uVar16) * 2 + 1;
        local_19a8 = (uVar1 & uVar16) * 2;
        hasher->buckets_[uVar2] = (uint32_t)uVar16;
        uVar19 = 0;
        uVar10 = 0;
        lVar22 = 0x40;
        while (uVar16 != uVar4) {
          bVar28 = lVar22 == 0;
          lVar22 = lVar22 + -1;
          if ((uVar1 - 0xf < uVar16 - uVar4) || (bVar28)) break;
          uVar21 = uVar10;
          if (uVar19 < uVar10) {
            uVar21 = uVar19;
          }
          if (0x80 < uVar21) goto LAB_0010ddfc;
          puVar27 = ringbuffer + (uVar4 & local_1978);
          uVar15 = 0x80 - uVar21;
          uVar25 = (ulong)((uint)uVar15 & 0xf8);
          uVar11 = 0;
          lVar18 = 0;
LAB_0010dc20:
          if (uVar15 >> 3 == uVar11) {
            uVar20 = (ulong)((uint)uVar15 & 7);
            puVar9 = puVar27 + (uVar21 - lVar18);
            for (; (bVar28 = uVar20 != 0, uVar20 = uVar20 - 1, uVar11 = uVar15, bVar28 &&
                   (uVar11 = uVar25, puVar26[uVar25 + uVar21] == *puVar9)); uVar25 = uVar25 + 1) {
              puVar9 = puVar9 + 1;
            }
          }
          else {
            if (*(ulong *)(puVar27 + uVar11 * 8 + uVar21) ==
                *(ulong *)(puVar26 + uVar11 * 8 + uVar21)) goto code_r0x0010dc36;
            uVar11 = *(ulong *)(puVar26 + uVar11 * 8 + uVar21) ^
                     *(ulong *)(puVar27 + uVar11 * 8 + uVar21);
            uVar25 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
              }
            }
            uVar11 = (uVar25 >> 3 & 0x1fffffff) - lVar18;
          }
          uVar11 = uVar11 + uVar21;
          iVar3 = bcmp(puVar26,puVar27,uVar11);
          if (iVar3 != 0) goto LAB_0010de1b;
          local_1998 = (uint)uVar1;
          if (0x7f < uVar11) {
            puVar7 = hasher->forest_;
            puVar7[local_19a8] = puVar7[(ulong)(local_1998 & uVar4) * 2];
            uVar8 = puVar7[(ulong)(local_1998 & uVar4) * 2 + 1];
            goto LAB_0010dd36;
          }
          uVar21 = (ulong)(uVar4 & local_1998) * 2;
          puVar7 = hasher->forest_;
          if (puVar27[uVar11] < puVar26[uVar11]) {
            puVar7[local_19a8] = uVar4;
            uVar21 = uVar21 | 1;
            uVar19 = uVar11;
            local_19a8 = uVar21;
          }
          else {
            puVar7[local_19a0] = uVar4;
            uVar10 = uVar11;
            local_19a0 = uVar21;
          }
          uVar4 = puVar7[uVar21];
        }
        uVar8 = hasher->invalid_pos_;
        puVar7 = hasher->forest_;
        puVar7[local_19a8] = uVar8;
LAB_0010dd36:
        puVar7[local_19a0] = uVar8;
      }
      while (uVar17 = uVar17 - 1, uVar17 != 0) {
        if (num_bytes <= sVar24 + 4) {
          sVar24 = sVar24 + 1;
          break;
        }
        sVar24 = sVar24 + 1;
        EvaluateNode(position,sVar24,max_backward_limit,dist_cache,&local_1368,&queue,nodes);
      }
    }
    sVar24 = sVar24 + 1;
  } while( true );
code_r0x0010d41c:
  lVar22 = lVar22 + -8;
  uVar21 = uVar21 + 1;
  goto LAB_0010d40a;
code_r0x0010d59f:
  lVar18 = lVar18 + -8;
  uVar20 = uVar20 + 1;
  goto LAB_0010d589;
code_r0x0010da22:
  lVar18 = lVar18 + -8;
  uVar15 = uVar15 + 1;
  goto LAB_0010da0c;
code_r0x0010dc36:
  lVar18 = lVar18 + -8;
  uVar11 = uVar11 + 1;
  goto LAB_0010dc20;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
                                       size_t num_bytes,
                                       size_t position,
                                       const uint8_t* ringbuffer,
                                       size_t ringbuffer_mask,
                                       const BrotliEncoderParams* params,
                                       const size_t max_backward_limit,
                                       const int* dist_cache,
                                       H10* hasher,
                                       ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[MAX_NUM_MATCHES_H10];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t num_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, num_bytes - i, max_distance, params, matches);
    size_t skip;
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(
            position, i, max_backward_limit, dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}